

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::anon_unknown_0::BasicBuiltinVariables::RunIteration
          (BasicBuiltinVariables *this,uvec3 *param_1,uvec3 *num_groups,bool dispatch_indirect)

{
  CallLogWrapper *this_00;
  GLuint *buffers;
  undefined8 uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  GLuint GVar9;
  undefined4 extraout_EAX;
  int iVar10;
  undefined4 extraout_EAX_00;
  undefined4 extraout_EAX_01;
  undefined4 extraout_EAX_02;
  ostream *poVar11;
  uint uVar12;
  bool *compile_error;
  uint uVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  uvec3 global_size;
  Vector<unsigned_int,_4> local_258;
  Vector<unsigned_int,_4> local_248;
  ulong local_238;
  ulong local_230;
  string local_228;
  Vector<unsigned_int,_4> local_208;
  Vector<unsigned_int,_4> local_1f8;
  Vector<unsigned_int,_4> local_1e8;
  Vector<unsigned_int,_4> local_1d8;
  Vector<unsigned_int,_4> local_1c8;
  vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_> data;
  
  if (this->m_program != 0) {
    glu::CallLogWrapper::glDeleteProgram
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_program);
  }
  tcu::operator*((tcu *)&global_size,param_1,num_groups);
  std::__cxx11::stringstream::stringstream((stringstream *)&data);
  poVar11 = std::operator<<((ostream *)
                            &data.
                             super__Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                            "\nlayout(local_size_x = ");
  poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
  poVar11 = std::operator<<(poVar11,", local_size_y = ");
  poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
  poVar11 = std::operator<<(poVar11,", local_size_z = ");
  poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
  poVar11 = std::operator<<(poVar11,") in;\nconst uvec3 kGlobalSize = uvec3(");
  poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
  poVar11 = std::operator<<(poVar11,", ");
  poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
  poVar11 = std::operator<<(poVar11,", ");
  poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
  poVar11 = std::operator<<(poVar11,
                            ");\nlayout(std430) buffer OutputBuffer {\n  uvec4 num_work_groups[");
  poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
  poVar11 = std::operator<<(poVar11,"];\n  uvec4 work_group_size[");
  poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
  poVar11 = std::operator<<(poVar11,"];\n  uvec4 work_group_id[");
  poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
  poVar11 = std::operator<<(poVar11,"];\n  uvec4 local_invocation_id[");
  poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
  poVar11 = std::operator<<(poVar11,"];\n  uvec4 global_invocation_id[");
  poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
  poVar11 = std::operator<<(poVar11,"];\n  uvec4 local_invocation_index[");
  poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
  std::operator<<(poVar11,
                  "];\n} g_out_buffer;\nvoid main() {\n  if ((gl_WorkGroupSize * gl_WorkGroupID + gl_LocalInvocationID) != gl_GlobalInvocationID) return;\n  const uint global_index = gl_GlobalInvocationID.x +\n                            gl_GlobalInvocationID.y * kGlobalSize.x +\n                            gl_GlobalInvocationID.z * kGlobalSize.x * kGlobalSize.y;\n  g_out_buffer.num_work_groups[global_index] = uvec4(gl_NumWorkGroups, 0);\n  g_out_buffer.work_group_size[global_index] = uvec4(gl_WorkGroupSize, 0);\n  g_out_buffer.work_group_id[global_index] = uvec4(gl_WorkGroupID, 0);\n  g_out_buffer.local_invocation_id[global_index] = uvec4(gl_LocalInvocationID, 0);\n  g_out_buffer.global_invocation_id[global_index] = uvec4(gl_GlobalInvocationID, 0);\n  g_out_buffer.local_invocation_index[global_index] = uvec4(gl_LocalInvocationIndex);\n}"
                 );
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&data);
  GVar9 = ComputeShaderBase::CreateComputeProgram(&this->super_ComputeShaderBase,&local_228);
  this->m_program = GVar9;
  std::__cxx11::string::~string((string *)&local_228);
  this_00 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glLinkProgram(this_00,this->m_program);
  bVar8 = ComputeShaderBase::CheckProgram
                    (&this->super_ComputeShaderBase,this->m_program,compile_error);
  if (bVar8) {
    uVar12 = num_groups->m_data[0] * param_1->m_data[0] * param_1->m_data[1] * num_groups->m_data[1]
             * param_1->m_data[2] * num_groups->m_data[2];
    uVar15 = (ulong)uVar12;
    local_238 = (ulong)(uVar12 * 6);
    std::vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>::
    vector(&data,local_238,(allocator_type *)&local_228);
    buffers = &this->m_storage_buffer;
    GVar9 = this->m_storage_buffer;
    if (GVar9 == 0) {
      glu::CallLogWrapper::glGenBuffers(this_00,1,buffers);
      GVar9 = *buffers;
    }
    glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,0,GVar9);
    glu::CallLogWrapper::glBufferData
              (this_00,0x90d2,uVar15 * 0x60,
               data.
               super__Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
               ._M_impl.super__Vector_impl_data._M_start,0x88e8);
    glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,0);
    glu::CallLogWrapper::glUseProgram(this_00,this->m_program);
    if (dispatch_indirect) {
      GVar9 = this->m_dispatch_buffer;
      if (GVar9 == 0) {
        glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_dispatch_buffer);
        GVar9 = this->m_dispatch_buffer;
      }
      glu::CallLogWrapper::glBindBuffer(this_00,0x90ee,GVar9);
      glu::CallLogWrapper::glBufferData(this_00,0x90ee,0xc,num_groups,0x88e4);
      glu::CallLogWrapper::glDispatchComputeIndirect(this_00,0);
    }
    else {
      glu::CallLogWrapper::glDispatchCompute
                (this_00,num_groups->m_data[0],num_groups->m_data[1],num_groups->m_data[2]);
    }
    glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,*buffers);
    glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
    glu::CallLogWrapper::glGetBufferSubData
              (this_00,0x90d2,0,uVar15 * 0x60,
               data.
               super__Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
    lVar14 = 0;
    for (uVar16 = 0; uVar15 != uVar16; uVar16 = uVar16 + 1) {
      tcu::Vector<unsigned_int,_4>::Vector
                (&local_1c8,
                 (Vector<unsigned_int,_4> *)
                 ((long)(data.
                         super__Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar14));
      uVar1 = *(undefined8 *)(num_groups->m_data + 1);
      auVar17._0_4_ = -(uint)(num_groups->m_data[0] == local_1c8.m_data[0]);
      auVar17._4_4_ = -(uint)((uint)uVar1 == local_1c8.m_data[1]);
      auVar17._8_4_ = -(uint)((uint)((ulong)uVar1 >> 0x20) == local_1c8.m_data[2]);
      auVar17._12_4_ = -(uint)(local_1c8.m_data[3] == 0);
      iVar10 = movmskps(extraout_EAX,auVar17);
      if (iVar10 != 0xf) {
        bVar8 = false;
        anon_unknown_0::Output
                  ("gl_NumWorkGroups: Invalid data at index %d.\n",uVar1,uVar16 & 0xffffffff);
        goto LAB_009ce417;
      }
      lVar14 = lVar14 + 0x10;
    }
    uVar16 = (ulong)(uVar12 * 2);
    lVar14 = uVar15 << 4;
    for (; uVar15 < uVar16; uVar15 = uVar15 + 1) {
      tcu::Vector<unsigned_int,_4>::Vector
                (&local_1d8,
                 (Vector<unsigned_int,_4> *)
                 ((long)(data.
                         super__Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar14));
      uVar1 = *(undefined8 *)(param_1->m_data + 1);
      auVar18._0_4_ = -(uint)(param_1->m_data[0] == local_1d8.m_data[0]);
      auVar18._4_4_ = -(uint)((uint)uVar1 == local_1d8.m_data[1]);
      auVar18._8_4_ = -(uint)((uint)((ulong)uVar1 >> 0x20) == local_1d8.m_data[2]);
      auVar18._12_4_ = -(uint)(local_1d8.m_data[3] == 0);
      iVar10 = movmskps((int)param_1,auVar18);
      if (iVar10 != 0xf) {
        bVar8 = false;
        anon_unknown_0::Output
                  ("gl_WorkGroupSize: Invalid data at index %d.\n",uVar1,uVar15 & 0xffffffff);
        goto LAB_009ce417;
      }
      lVar14 = lVar14 + 0x10;
    }
    uVar15 = (ulong)(uVar12 * 3);
    lVar14 = uVar16 << 4;
    uVar13 = 0;
    for (; uVar16 < uVar15; uVar16 = uVar16 + 1) {
      uVar2 = param_1->m_data[0];
      uVar3 = param_1->m_data[1];
      uVar5 = (ulong)(num_groups->m_data[0] * uVar2);
      uVar7 = uVar13 / uVar5;
      uVar6 = (ulong)(num_groups->m_data[1] * uVar3);
      uVar4 = param_1->m_data[2];
      tcu::Vector<unsigned_int,_4>::Vector
                (&local_1e8,
                 (Vector<unsigned_int,_4> *)
                 ((long)(data.
                         super__Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar14));
      auVar19._0_4_ = -(uint)((uint)(((ulong)uVar13 % uVar5) / (ulong)uVar2) == local_1e8.m_data[0])
      ;
      auVar19._4_4_ = -(uint)((uint)((uVar7 % uVar6) / (ulong)uVar3) == local_1e8.m_data[1]);
      auVar19._8_4_ = -(uint)((uint)((uVar7 / uVar6) / (ulong)uVar4) == local_1e8.m_data[2]);
      auVar19._12_4_ = -(uint)(local_1e8.m_data[3] == 0);
      iVar10 = movmskps(extraout_EAX_00,auVar19);
      if (iVar10 != 0xf) {
        bVar8 = false;
        anon_unknown_0::Output("gl_WorkGroupID: Invalid data at index %d.\n",uVar16 & 0xffffffff);
        goto LAB_009ce417;
      }
      uVar13 = uVar13 + 1;
      lVar14 = lVar14 + 0x10;
    }
    local_230 = (ulong)(uVar12 * 4);
    lVar14 = uVar15 << 4;
    uVar13 = 0;
    for (; uVar15 < local_230; uVar15 = uVar15 + 1) {
      uVar2 = param_1->m_data[0];
      uVar3 = param_1->m_data[1];
      uVar16 = (ulong)(num_groups->m_data[0] * uVar2);
      uVar6 = uVar13 / uVar16;
      uVar5 = (ulong)(num_groups->m_data[1] * uVar3);
      uVar4 = param_1->m_data[2];
      tcu::Vector<unsigned_int,_4>::Vector
                (&local_1f8,
                 (Vector<unsigned_int,_4> *)
                 ((long)(data.
                         super__Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar14));
      auVar20._0_4_ =
           -(uint)((uint)(((ulong)uVar13 % uVar16) % (ulong)uVar2) == local_1f8.m_data[0]);
      auVar20._4_4_ = -(uint)((uint)((uVar6 % uVar5) % (ulong)uVar3) == local_1f8.m_data[1]);
      auVar20._8_4_ = -(uint)((uint)((uVar6 / uVar5) % (ulong)uVar4) == local_1f8.m_data[2]);
      auVar20._12_4_ = -(uint)(local_1f8.m_data[3] == 0);
      iVar10 = movmskps(extraout_EAX_01,auVar20);
      if (iVar10 != 0xf) {
        bVar8 = false;
        anon_unknown_0::Output
                  ("gl_LocalInvocationID: Invalid data at index %d.\n",uVar15 & 0xffffffff);
        goto LAB_009ce417;
      }
      uVar13 = uVar13 + 1;
      lVar14 = lVar14 + 0x10;
    }
    uVar16 = (ulong)(uVar12 * 5);
    lVar14 = local_230 << 4;
    uVar12 = 0;
    for (uVar15 = local_230; uVar5 = local_238, uVar15 < uVar16; uVar15 = uVar15 + 1) {
      uVar13 = num_groups->m_data[0] * param_1->m_data[0];
      uVar6 = (ulong)uVar12 / (ulong)uVar13;
      uVar5 = (ulong)(num_groups->m_data[1] * param_1->m_data[1]);
      tcu::Vector<unsigned_int,_4>::Vector
                (&local_208,
                 (Vector<unsigned_int,_4> *)
                 ((long)(data.
                         super__Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar14));
      auVar21._0_4_ = -(uint)(uVar12 % uVar13 == local_208.m_data[0]);
      auVar21._4_4_ = -(uint)((uint)(uVar6 % uVar5) == local_208.m_data[1]);
      auVar21._8_4_ = -(uint)((uint)(uVar6 / uVar5) == local_208.m_data[2]);
      auVar21._12_4_ = -(uint)(local_208.m_data[3] == 0);
      iVar10 = movmskps(extraout_EAX_02,auVar21);
      if (iVar10 != 0xf) {
        bVar8 = false;
        anon_unknown_0::Output
                  ("gl_GlobalInvocationID: Invalid data at index %d.\n",uVar15 & 0xffffffff);
        goto LAB_009ce417;
      }
      uVar12 = uVar12 + 1;
      lVar14 = lVar14 + 0x10;
    }
    lVar14 = uVar16 << 4;
    uVar12 = 0;
    for (; uVar16 < uVar5; uVar16 = uVar16 + 1) {
      uVar13 = param_1->m_data[0];
      uVar2 = param_1->m_data[1];
      uVar15 = (ulong)(num_groups->m_data[0] * uVar13);
      uVar7 = uVar12 / uVar15;
      uVar6 = (ulong)(num_groups->m_data[1] * uVar2);
      uVar3 = param_1->m_data[2];
      tcu::Vector<unsigned_int,_4>::Vector
                (&local_248,
                 (Vector<unsigned_int,_4> *)
                 ((long)(data.
                         super__Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar14));
      tcu::Vector<unsigned_int,_4>::Vector
                (&local_258,
                 (uVar2 * (int)((uVar7 / uVar6) % (ulong)uVar3) +
                 (int)((uVar7 % uVar6) % (ulong)uVar2)) * uVar13 +
                 (int)(((ulong)uVar12 % uVar15) % (ulong)uVar13));
      if ((((local_248.m_data[0] != local_258.m_data[0]) ||
           (local_248.m_data[1] != local_258.m_data[1])) ||
          (local_248.m_data[2] != local_258.m_data[2])) ||
         (local_248.m_data[3] != local_258.m_data[3])) {
        bVar8 = false;
        anon_unknown_0::Output
                  ("gl_LocalInvocationIndex: Invalid data at index %d.\n",uVar16 & 0xffffffff);
        goto LAB_009ce417;
      }
      uVar12 = uVar12 + 1;
      lVar14 = lVar14 + 0x10;
    }
    bVar8 = true;
LAB_009ce417:
    std::_Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
    ::~_Vector_base(&data.
                     super__Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                   );
  }
  else {
    bVar8 = false;
  }
  return bVar8;
}

Assistant:

bool RunIteration(const uvec3& local_size, const uvec3& num_groups, bool dispatch_indirect)
	{
		if (m_program != 0)
			glDeleteProgram(m_program);
		m_program = CreateComputeProgram(GenSource(local_size, num_groups));
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return false;

		const GLuint kBufferSize =
			local_size.x() * num_groups.x() * local_size.y() * num_groups.y() * local_size.z() * num_groups.z();

		std::vector<uvec4> data(kBufferSize * 6);
		if (m_storage_buffer == 0)
			glGenBuffers(1, &m_storage_buffer);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_storage_buffer);
		glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(uvec4) * kBufferSize * 6, &data[0], GL_DYNAMIC_DRAW);
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);

		glUseProgram(m_program);
		if (dispatch_indirect)
		{
			if (m_dispatch_buffer == 0)
				glGenBuffers(1, &m_dispatch_buffer);
			glBindBuffer(GL_DISPATCH_INDIRECT_BUFFER, m_dispatch_buffer);
			glBufferData(GL_DISPATCH_INDIRECT_BUFFER, sizeof(num_groups), &num_groups[0], GL_STATIC_DRAW);
			glDispatchComputeIndirect(0);
		}
		else
		{
			glDispatchCompute(num_groups.x(), num_groups.y(), num_groups.z());
		}

		glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
		glGetBufferSubData(GL_SHADER_STORAGE_BUFFER, 0, sizeof(uvec4) * kBufferSize * 6, &data[0]);

		// gl_NumWorkGroups
		for (GLuint index = 0; index < kBufferSize; ++index)
		{
			if (!IsEqual(data[index], uvec4(num_groups.x(), num_groups.y(), num_groups.z(), 0)))
			{
				Output("gl_NumWorkGroups: Invalid data at index %d.\n", index);
				return false;
			}
		}
		// gl_WorkGroupSize
		for (GLuint index = kBufferSize; index < 2 * kBufferSize; ++index)
		{
			if (!IsEqual(data[index], uvec4(local_size.x(), local_size.y(), local_size.z(), 0)))
			{
				Output("gl_WorkGroupSize: Invalid data at index %d.\n", index);
				return false;
			}
		}
		// gl_WorkGroupID
		for (GLuint index = 2 * kBufferSize; index < 3 * kBufferSize; ++index)
		{
			uvec3 expected = IndexTo3DCoord(index - 2 * kBufferSize, local_size.x() * num_groups.x(),
											local_size.y() * num_groups.y());
			expected.x() /= local_size.x();
			expected.y() /= local_size.y();
			expected.z() /= local_size.z();
			if (!IsEqual(data[index], uvec4(expected.x(), expected.y(), expected.z(), 0)))
			{
				Output("gl_WorkGroupID: Invalid data at index %d.\n", index);
				return false;
			}
		}
		// gl_LocalInvocationID
		for (GLuint index = 3 * kBufferSize; index < 4 * kBufferSize; ++index)
		{
			uvec3 expected = IndexTo3DCoord(index - 3 * kBufferSize, local_size.x() * num_groups.x(),
											local_size.y() * num_groups.y());
			expected.x() %= local_size.x();
			expected.y() %= local_size.y();
			expected.z() %= local_size.z();
			if (!IsEqual(data[index], uvec4(expected.x(), expected.y(), expected.z(), 0)))
			{
				Output("gl_LocalInvocationID: Invalid data at index %d.\n", index);
				return false;
			}
		}
		// gl_GlobalInvocationID
		for (GLuint index = 4 * kBufferSize; index < 5 * kBufferSize; ++index)
		{
			uvec3 expected = IndexTo3DCoord(index - 4 * kBufferSize, local_size.x() * num_groups.x(),
											local_size.y() * num_groups.y());
			if (!IsEqual(data[index], uvec4(expected.x(), expected.y(), expected.z(), 0)))
			{
				Output("gl_GlobalInvocationID: Invalid data at index %d.\n", index);
				return false;
			}
		}
		// gl_LocalInvocationIndex
		for (GLuint index = 5 * kBufferSize; index < 6 * kBufferSize; ++index)
		{
			uvec3 coord = IndexTo3DCoord(index - 5 * kBufferSize, local_size.x() * num_groups.x(),
										 local_size.y() * num_groups.y());
			const GLuint expected = (coord.x() % local_size.x()) + (coord.y() % local_size.y()) * local_size.x() +
									(coord.z() % local_size.z()) * local_size.x() * local_size.y();
			if (!IsEqual(data[index], uvec4(expected)))
			{
				Output("gl_LocalInvocationIndex: Invalid data at index %d.\n", index);
				return false;
			}
		}
		return true;
	}